

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  long *plVar1;
  i64 *piVar2;
  byte bVar3;
  sqlite3_module *psVar4;
  sqlite3_value *pVal;
  Fts5Config *pFVar5;
  ushort *puVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar24;
  _func_int_sqlite3_vtab_cursor_ptr *p_Var13;
  char *pcVar14;
  long lVar15;
  i64 iDel;
  i64 iVar16;
  Mem *pMVar17;
  uchar *puVar18;
  Fts5Structure *pFVar19;
  Fts5Structure *pFVar20;
  u8 *puVar21;
  Fts5Data *pFVar22;
  Fts5DlidxIter *pIter;
  ulong uVar23;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  Fts5Iter *pFVar28;
  int iVar29;
  sqlite3_stmt *psVar30;
  int iVar31;
  Fts5StructureLevel *pFVar32;
  long lVar33;
  Fts5Storage *pFVar34;
  Fts5Index *pFVar35;
  Fts5StructureSegment *pFVar36;
  bool bVar37;
  int local_144;
  Fts5Iter *local_140;
  i64 nRow;
  undefined8 uStack_130;
  int rc;
  undefined4 uStack_124;
  ulong uStack_120;
  uchar *local_118;
  int nKeep;
  Fts5Buffer buf;
  Fts5Termset *pFStack_f0;
  sqlite3_stmt *pScan;
  ulong uStack_d0;
  ulong local_c8;
  sqlite3_stmt *pStmt;
  Fts5Structure *local_b8;
  ulong local_b0;
  int local_a4;
  void *local_a0;
  ulong local_98;
  sqlite3_vtab *local_90;
  sqlite3_stmt *pScan_1;
  int local_80;
  int nTerm;
  u32 local_78;
  int nIncr;
  Fts5StructureLevel *local_70;
  Fts5Index *local_68;
  ulong local_60;
  long local_58;
  Fts5StructureLevel *local_50;
  long local_48;
  Fts5StructureSegment *local_40;
  i64 local_38;
  
  psVar4 = pVtab[1].pModule;
  local_144 = 0;
  psVar4->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)&pVtab->zErrMsg;
  for (p_Var13 = (pVtab[2].pModule)->xNext; p_Var13 != (_func_int_sqlite3_vtab_cursor_ptr *)0x0;
      p_Var13 = *(_func_int_sqlite3_vtab_cursor_ptr **)(p_Var13 + 8)) {
    if ((*(int *)(p_Var13 + 0x20) == 1) && (*(sqlite3_vtab **)p_Var13 == pVtab)) {
      p_Var13[0x50] = (_func_int_sqlite3_vtab_cursor_ptr)((byte)p_Var13[0x50] | 0x20);
    }
  }
  uVar24 = (*apVal)->flags & 0x3f;
  if (((0xaaaaaaaaaaaaaaaaU >> uVar24 & 1) != 0) &&
     (pVal = apVal[(long)*(int *)&psVar4->xBestIndex + 2], uVar12._0_2_ = pVal->flags,
     uVar12._2_1_ = pVal->enc, uVar12._3_1_ = pVal->eSubtype,
     (0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar12 & 0x3f) & 1) == 0)) {
    pcVar14 = (char *)sqlite3ValueText(pVal,'\x01');
    local_90 = pVtab;
    if ((*(int *)&psVar4->xFilter != 0) && (pcVar14 != (char *)0x0)) {
      lVar15 = 0;
      do {
        bVar3 = "secure_delete"[lVar15 + 7];
        if (bVar3 == pcVar14[lVar15]) {
          if ((ulong)bVar3 == 0) goto LAB_001c471b;
        }
        else if (""[bVar3] != ""[(byte)pcVar14[lVar15]]) break;
        lVar15 = lVar15 + 1;
      } while( true );
    }
    pMVar17 = apVal[(long)*(int *)&psVar4->xBestIndex + 3];
    local_a4 = 0;
    if (pcVar14 != (char *)0x0) {
      lVar15 = 0;
      do {
        bVar3 = "delete-all"[lVar15];
        if (bVar3 == pcVar14[lVar15]) {
          if ((ulong)bVar3 == 0) goto LAB_001c4758;
        }
        else if (""[bVar3] != ""[(byte)pcVar14[lVar15]]) {
          if (pcVar14 == (char *)0x0) break;
          lVar15 = 0;
          goto LAB_001c4782;
        }
        lVar15 = lVar15 + 1;
      } while( true );
    }
LAB_001c4cd1:
    pFVar35 = *(Fts5Index **)&pVtab[1].nRef;
    pFVar19 = fts5StructureRead(pFVar35);
    fts5StructureRelease(pFVar19);
    iVar8 = pFVar35->rc;
    pFVar35->rc = 0;
    if (iVar8 == 0) {
      iVar8 = sqlite3Fts5ConfigSetValue((Fts5Config *)local_90[1].pModule,pcVar14,pMVar17,&local_a4)
      ;
    }
    pVtab = local_90;
    if ((iVar8 == 0) && (iVar8 = 1, local_a4 == 0)) {
      iVar8 = sqlite3Fts5StorageConfigValue((Fts5Storage *)local_90[1].zErrMsg,pcVar14,pMVar17,0);
      pVtab = local_90;
    }
    goto LAB_001c4d52;
  }
  if (*(int *)&psVar4->xFilter == 0) {
    bVar37 = *(char *)(*(long *)psVar4 + 0x66) == '\x05';
  }
  else {
    bVar37 = false;
  }
  if (*(int *)&psVar4->xFilter == 1 && (0x50505050UL >> uVar24 & 1) != 0) {
    pcVar14 = "DELETE from";
    if (1 < nArg) {
      pcVar14 = "UPDATE";
    }
    pcVar14 = sqlite3_mprintf("cannot %s contentless fts5 table: %s",pcVar14,psVar4->xConnect);
    pVtab->zErrMsg = pcVar14;
    local_144 = 1;
    iVar8 = local_144;
    goto LAB_001c4d52;
  }
  if (nArg == 1) {
    iVar16 = sqlite3VdbeIntValue(*apVal);
    iVar8 = sqlite3Fts5StorageDelete((Fts5Storage *)pVtab[1].zErrMsg,iVar16,(sqlite3_value **)0x0);
    goto LAB_001c4d52;
  }
  local_140 = (Fts5Iter *)pRowid;
  uVar12 = sqlite3_value_numeric_type(apVal[1]);
  if ((uVar12 & 0xfffffffb) != 1) {
    local_144 = 0x14;
    iVar8 = local_144;
    goto LAB_001c4d52;
  }
  if ((0x50505050UL >> (sbyte)uVar24 & 1) == 0) {
    if (bVar37 && uVar12 == 1) {
      iVar16 = sqlite3VdbeIntValue(apVal[1]);
      pFVar34 = (Fts5Storage *)pVtab[1].zErrMsg;
LAB_001c47cf:
      local_144 = sqlite3Fts5StorageDelete(pFVar34,iVar16,(sqlite3_value **)0x0);
    }
  }
  else {
    iDel = sqlite3VdbeIntValue(*apVal);
    iVar16 = sqlite3VdbeIntValue(apVal[1]);
    pFVar34 = (Fts5Storage *)pVtab[1].zErrMsg;
    if (iDel == iVar16 || uVar12 != 1) {
      local_144 = sqlite3Fts5StorageDelete(pFVar34,iDel,(sqlite3_value **)0x0);
    }
    else {
      if (!bVar37) {
        local_144 = sqlite3Fts5StorageContentInsert(pFVar34,apVal,(i64 *)local_140);
        if (local_144 == 0) {
          local_144 = sqlite3Fts5StorageDelete
                                ((Fts5Storage *)pVtab[1].zErrMsg,iDel,(sqlite3_value **)0x0);
        }
        iVar8 = local_144;
        if (local_144 == 0) {
          iVar8 = sqlite3Fts5StorageIndexInsert
                            ((Fts5Storage *)pVtab[1].zErrMsg,apVal,*(i64 *)local_140);
        }
        goto LAB_001c4d52;
      }
      local_144 = sqlite3Fts5StorageDelete(pFVar34,iDel,(sqlite3_value **)0x0);
      if (local_144 == 0) {
        pFVar34 = (Fts5Storage *)pVtab[1].zErrMsg;
        local_144 = 0;
        goto LAB_001c47cf;
      }
    }
  }
  fts5StorageInsert(&local_144,(Fts5FullTable *)pVtab,apVal,(i64 *)local_140);
  iVar8 = local_144;
  goto LAB_001c4d52;
LAB_001c471b:
  pMVar17 = apVal[1];
  uVar24._0_2_ = pMVar17->flags;
  uVar24._2_1_ = pMVar17->enc;
  uVar24._3_1_ = pMVar17->eSubtype;
  iVar8 = 0;
  if ((0x50505050UL >> ((ulong)uVar24 & 0x3f) & 1) != 0) {
    iVar16 = sqlite3VdbeIntValue(pMVar17);
    iVar8 = sqlite3Fts5StorageDelete((Fts5Storage *)local_90[1].zErrMsg,iVar16,apVal + 2);
    pVtab = local_90;
  }
  goto LAB_001c4d52;
LAB_001c4782:
  bVar3 = "rebuild"[lVar15];
  if (bVar3 == pcVar14[lVar15]) {
    if ((ulong)bVar3 == 0) goto LAB_001c481e;
  }
  else if (""[bVar3] != ""[(byte)pcVar14[lVar15]]) {
    if (pcVar14 == (char *)0x0) goto LAB_001c4cd1;
    lVar15 = 0;
    goto LAB_001c4855;
  }
  lVar15 = lVar15 + 1;
  goto LAB_001c4782;
LAB_001c4855:
  bVar3 = "optimize"[lVar15];
  if (bVar3 == pcVar14[lVar15]) {
    if ((ulong)bVar3 == 0) goto LAB_001c4abc;
  }
  else if (""[bVar3] != ""[(byte)pcVar14[lVar15]]) {
    if (pcVar14 == (char *)0x0) goto LAB_001c4cd1;
    lVar15 = 0;
    goto LAB_001c4ba1;
  }
  lVar15 = lVar15 + 1;
  goto LAB_001c4855;
LAB_001c4ba1:
  bVar3 = "automerge"[lVar15 + 4];
  if (bVar3 == pcVar14[lVar15]) {
    if ((ulong)bVar3 == 0) goto LAB_001c4bd5;
  }
  else if (""[bVar3] != ""[(byte)pcVar14[lVar15]]) {
    if (pcVar14 == (char *)0x0) goto LAB_001c4cd1;
    lVar15 = 0;
    goto LAB_001c4caa;
  }
  lVar15 = lVar15 + 1;
  goto LAB_001c4ba1;
LAB_001c4caa:
  bVar3 = "integrity-check"[lVar15];
  if (bVar3 == pcVar14[lVar15]) {
    if ((ulong)bVar3 == 0) goto LAB_001c4d77;
  }
  else if (""[bVar3] != ""[(byte)pcVar14[lVar15]]) goto LAB_001c4cd1;
  lVar15 = lVar15 + 1;
  goto LAB_001c4caa;
LAB_001c4bd5:
  iVar16 = sqlite3VdbeIntValue(pMVar17);
  iVar8 = (int)iVar16;
  pFVar35 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
  pFVar19 = fts5StructureRead(pFVar35);
  if (pFVar19 != (Fts5Structure *)0x0) {
    iVar31 = pFVar35->pConfig->nUsermerge;
    buf.p = (u8 *)pFVar19;
    if (pFVar35->pStruct != (Fts5Structure *)0x0) {
      fts5StructureRelease(pFVar35->pStruct);
      pFVar35->pStruct = (Fts5Structure *)0x0;
    }
    if (iVar8 < 0) {
      pFVar20 = fts5IndexOptimizeStruct(pFVar35,pFVar19);
      fts5StructureRelease(pFVar19);
      iVar8 = -iVar8;
      iVar31 = 2;
      buf.p = (u8 *)pFVar20;
    }
    pFVar19 = (Fts5Structure *)buf.p;
    if (((buf.p != (u8 *)0x0) && (*(int *)(buf.p + 0x14) != 0)) &&
       (iVar8 = fts5IndexMerge(pFVar35,(Fts5Structure **)&buf,iVar8,iVar31),
       pFVar19 = (Fts5Structure *)buf.p, iVar8 != 0)) {
      fts5StructureWrite(pFVar35,(Fts5Structure *)buf.p);
      pFVar19 = (Fts5Structure *)buf.p;
    }
    goto LAB_001c4c86;
  }
  goto LAB_001c4c8b;
LAB_001c4abc:
  pFVar35 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
  buf.p = (u8 *)0x0;
  fts5IndexFlush(pFVar35);
  pFVar19 = fts5StructureRead(pFVar35);
  if (pFVar35->pStruct != (Fts5Structure *)0x0) {
    fts5StructureRelease(pFVar35->pStruct);
    pFVar35->pStruct = (Fts5Structure *)0x0;
  }
  if (pFVar19 != (Fts5Structure *)0x0) {
    buf.p = (u8 *)fts5IndexOptimizeStruct(pFVar35,pFVar19);
  }
  fts5StructureRelease(pFVar19);
  if (buf.p != (u8 *)0x0) {
    iVar8 = -1;
    lVar15 = 0;
    do {
      lVar26 = lVar15;
      iVar8 = iVar8 + 1;
      lVar15 = lVar26 + 0x10;
    } while (*(int *)(buf.p + lVar26 + 0x1c) == 0);
    if (pFVar35->rc == 0) {
      do {
        if (*(int *)(buf.p + lVar26 + 0x1c) < 1) break;
        nRow = CONCAT44(nRow._4_4_,1000);
        fts5IndexMergeLevel(pFVar35,(Fts5Structure **)&buf,iVar8,(int *)&nRow);
      } while (pFVar35->rc == 0);
    }
    pFVar19 = (Fts5Structure *)buf.p;
    fts5StructureWrite(pFVar35,(Fts5Structure *)buf.p);
LAB_001c4c86:
    fts5StructureRelease(pFVar19);
  }
LAB_001c4c8b:
  iVar8 = pFVar35->rc;
  pFVar35->rc = 0;
  pVtab = local_90;
  goto LAB_001c4d52;
LAB_001c481e:
  if (*(int *)&(pVtab[1].pModule)->xFilter != 1) {
    pFVar34 = (Fts5Storage *)pVtab[1].zErrMsg;
    buf.p = (u8 *)0x0;
    buf.n = 0;
    buf.nSpace = 0;
    pFVar5 = pFVar34->pConfig;
    pScan = (sqlite3_stmt *)0x0;
    uStack_130 = 0;
    nRow = (i64)pFVar34;
    iVar8 = sqlite3Fts5StorageDeleteAll(pFVar34);
    rc = iVar8;
    if (iVar8 == 0) {
      rc = fts5StorageLoadTotals(pFVar34,1);
    }
    if (rc == 0) {
      rc = fts5StorageGetStmt(pFVar34,10,&pScan,(char **)0x0);
    }
    psVar30 = pScan;
    bVar37 = rc == 0;
    if (bVar37) {
      iVar8 = sqlite3_step(pScan);
      while (iVar8 == 100) {
        pMVar17 = columnMem(psVar30,0);
        iVar16 = sqlite3VdbeIntValue(pMVar17);
        columnMallocFailure(psVar30);
        buf._8_8_ = buf._8_8_ & 0xffffffff00000000;
        rc = sqlite3Fts5IndexBeginWrite(pFVar34->pIndex,0,iVar16);
        uStack_130 = uStack_130 & 0xffffffff00000000;
        if (rc == 0) {
          iVar8 = 0;
          if (0 < pFVar5->nCol) {
            iVar31 = 0;
            do {
              uStack_130 = uStack_130 & 0xffffffff;
              if (pFVar5->abUnindexed[iVar31] == '\0') {
                puVar18 = sqlite3_column_text(psVar30,iVar31 + 1);
                iVar8 = sqlite3_column_bytes(psVar30,(u32)uStack_130 + 1);
                if (puVar18 == (uchar *)0x0) {
                  rc = 0;
                }
                else {
                  rc = (*pFVar5->pTokApi->xTokenize)
                                 (pFVar5->pTok,&nRow,4,(char *)puVar18,iVar8,
                                  fts5StorageInsertCallback);
                }
              }
              sqlite3Fts5BufferAppendVarint(&rc,&buf,(long)uStack_130._4_4_);
              pFVar34->aTotalSize[(int)(u32)uStack_130] =
                   pFVar34->aTotalSize[(int)(u32)uStack_130] + (long)uStack_130._4_4_;
              iVar31 = (u32)uStack_130 + 1;
              uStack_130 = CONCAT44(uStack_130._4_4_,iVar31);
              if (rc != 0) goto LAB_001c498f;
              iVar8 = rc;
            } while (iVar31 < pFVar5->nCol);
          }
          rc = iVar8;
          pFVar34->nTotalRow = pFVar34->nTotalRow + 1;
          rc = fts5StorageInsertDocsize(pFVar34,iVar16,&buf);
        }
        else {
LAB_001c498f:
          pFVar34->nTotalRow = pFVar34->nTotalRow + 1;
        }
        bVar37 = rc == 0;
        if (!bVar37) goto LAB_001c4a83;
        iVar8 = sqlite3_step(psVar30);
      }
      bVar37 = true;
    }
LAB_001c4a83:
    sqlite3_free(buf.p);
    iVar8 = sqlite3_reset(pScan);
    if (bVar37) {
      rc = iVar8;
    }
    pVtab = local_90;
    iVar8 = rc;
    if (rc == 0) {
      iVar8 = fts5StorageSaveTotals(pFVar34);
      pVtab = local_90;
    }
    goto LAB_001c4d52;
  }
  pcVar14 = "\'rebuild\' may not be used with a contentless fts5 table";
  goto LAB_001c482f;
LAB_001c4758:
  if (*(int *)&(pVtab[1].pModule)->xFilter != 0) {
    iVar8 = sqlite3Fts5StorageDeleteAll((Fts5Storage *)pVtab[1].zErrMsg);
    pVtab = local_90;
    goto LAB_001c4d52;
  }
  pcVar14 = "\'delete-all\' may only be used with a contentless or external content fts5 table";
LAB_001c482f:
  fts5SetVtabError((Fts5FullTable *)pVtab,pcVar14);
  pVtab = local_90;
  iVar8 = 1;
  goto LAB_001c4d52;
LAB_001c4d77:
  pFVar34 = (Fts5Storage *)pVtab[1].zErrMsg;
  pFVar5 = pFVar34->pConfig;
  buf.p = (u8 *)0x0;
  buf.n = 0;
  buf.nSpace = 0;
  iVar8 = pFVar5->nCol;
  iVar31 = sqlite3_initialize();
  if (iVar31 == 0) {
    local_a0 = sqlite3Malloc((long)iVar8 * 0xc);
  }
  else {
    local_a0 = (void *)0x0;
  }
  if (local_a0 == (void *)0x0) {
    pVtab = local_90;
    iVar8 = 7;
  }
  else {
    iVar31 = pFVar5->nCol;
    iVar9 = 0;
    memset(local_a0,0,(long)iVar31 * 8);
    iVar8 = fts5StorageGetStmt(pFVar34,10,&pScan_1,(char **)0x0);
    psVar30 = pScan_1;
    if (iVar8 == 0) {
      iVar8 = sqlite3_step(pScan_1);
      if (iVar8 == 100) {
        local_140 = (Fts5Iter *)((long)local_a0 + (long)iVar31 * 8);
        iVar9 = 0;
        do {
          pFStack_f0 = (Fts5Termset *)0x0;
          pMVar17 = columnMem(psVar30,0);
          puVar21 = (u8 *)sqlite3VdbeIntValue(pMVar17);
          columnMallocFailure(psVar30);
          buf._8_8_ = buf._8_8_ & 0xffffffff;
          buf.p = puVar21;
          if (pFVar5->bColumnsize != 0) {
            iVar9 = sqlite3Fts5StorageDocsize(pFVar34,(i64)puVar21,(int *)local_140);
          }
          if ((iVar9 == 0) && (iVar9 = 0, pFVar5->eDetail == 1)) {
            nRow = nRow & 0xffffffff00000000;
            pFStack_f0 = (Fts5Termset *)sqlite3Fts5MallocZero((int *)&nRow,0x1000);
            iVar9 = (int)nRow;
          }
          psVar30 = pScan_1;
          if (iVar9 != 0) {
LAB_001c4ff6:
            sqlite3Fts5TermsetFree(pFStack_f0);
            break;
          }
          if (0 < pFVar5->nCol) {
            uVar27 = 0;
            do {
              iVar9 = 0;
              if (pFVar5->abUnindexed[uVar27] == '\0') {
                buf._8_8_ = uVar27 & 0xffffffff;
                iVar9 = 0;
                if (pFVar5->eDetail == 2) {
                  nRow = nRow & 0xffffffff00000000;
                  pFStack_f0 = (Fts5Termset *)sqlite3Fts5MallocZero((int *)&nRow,0x1000);
                  iVar9 = (int)nRow;
                }
                if (iVar9 == 0) {
                  iVar8 = (int)uVar27 + 1;
                  puVar18 = sqlite3_column_text(psVar30,iVar8);
                  iVar8 = sqlite3_column_bytes(psVar30,iVar8);
                  if (puVar18 == (uchar *)0x0) {
                    iVar9 = 0;
                  }
                  else {
                    iVar9 = (*pFVar5->pTokApi->xTokenize)
                                      (pFVar5->pTok,&buf,4,(char *)puVar18,iVar8,
                                       fts5StorageIntegrityCallback);
                  }
                }
                if (iVar9 == 0) {
                  if (pFVar5->bColumnsize == 0) {
                    iVar9 = 0;
                  }
                  else {
                    iVar9 = 0x10b;
                    if (buf.nSpace == *(int *)((long)local_140->aSeg + uVar27 * 4 + -0x60)) {
                      iVar9 = 0;
                    }
                  }
                }
                plVar1 = (long *)((long)local_a0 + uVar27 * 8);
                *plVar1 = *plVar1 + (long)buf.nSpace;
                if (pFVar5->eDetail == 2) {
                  sqlite3Fts5TermsetFree(pFStack_f0);
                  pFStack_f0 = (Fts5Termset *)0x0;
                }
              }
              if (iVar9 != 0) goto LAB_001c4ff6;
              uVar27 = uVar27 + 1;
            } while ((long)uVar27 < (long)pFVar5->nCol);
          }
          sqlite3Fts5TermsetFree(pFStack_f0);
          psVar30 = pScan_1;
          iVar8 = sqlite3_step(pScan_1);
        } while (iVar8 == 100);
      }
      iVar8 = sqlite3_reset(pScan_1);
      if (iVar9 != 0) {
        iVar8 = iVar9;
      }
    }
    if (((iVar8 == 0) && (iVar8 = fts5StorageLoadTotals(pFVar34,0), iVar8 == 0)) &&
       (0 < pFVar5->nCol)) {
      lVar15 = 0;
      do {
        piVar2 = pFVar34->aTotalSize + lVar15;
        lVar26 = *(long *)((long)local_a0 + lVar15 * 8);
        if (*piVar2 != lVar26) break;
        bVar37 = (ulong)(uint)pFVar5->nCol - 1 != lVar15;
        lVar15 = lVar15 + 1;
      } while (bVar37);
      iVar8 = 0x10b;
      if (*piVar2 == lVar26) {
        iVar8 = 0;
      }
    }
    if ((iVar8 == 0) && (iVar8 = 0, pFVar5->eContent == 0)) {
      nRow = 0;
      iVar8 = fts5StorageCount(pFVar34,"content",&nRow);
      if (iVar8 == 0) {
        iVar8 = 0x10b;
        if (nRow == pFVar34->nTotalRow) {
          iVar8 = 0;
        }
      }
    }
    if (iVar8 == 0) {
      if (pFVar5->bColumnsize == 0) {
        iVar8 = 0;
      }
      else {
        nRow = 0;
        iVar8 = fts5StorageCount(pFVar34,"docsize",&nRow);
        if (iVar8 == 0) {
          iVar8 = 0x10b;
          if (nRow == pFVar34->nTotalRow) {
            iVar8 = 0;
          }
        }
      }
    }
    if (iVar8 == 0) {
      pFVar35 = pFVar34->pIndex;
      local_60 = 0;
      local_80 = pFVar35->pConfig->eDetail;
      _rc = (u8 *)0x0;
      uStack_120 = 0;
      local_b8 = fts5StructureRead(pFVar35);
      local_68 = pFVar35;
      if ((local_b8 != (Fts5Structure *)0x0) && (0 < local_b8->nLevel)) {
        local_70 = local_b8->aLevel;
        pFVar28 = (Fts5Iter *)&pFVar35->rc;
        lVar15 = 0;
        local_140 = pFVar28;
        do {
          local_58 = lVar15;
          if (0 < local_70[lVar15].nSeg) {
            pFVar32 = local_70 + lVar15;
            lVar15 = 0;
            local_50 = pFVar32;
            do {
              pStmt = (sqlite3_stmt *)0x0;
              iVar8 = pFVar32->aSeg[lVar15].pgnoFirst;
              if (iVar8 != 0) {
                pFVar36 = pFVar32->aSeg + lVar15;
                local_b0 = (ulong)(uint)pFVar36->pgnoLast;
                local_98 = (ulong)(iVar8 - 1);
                local_48 = lVar15;
                pcVar14 = sqlite3_mprintf("SELECT segid, term, (pgno>>1), (pgno&1) FROM %Q.\'%q_idx\' WHERE segid=%d"
                                          ,pFVar35->pConfig->zDb,pFVar35->pConfig->zName);
                fts5IndexPrepareStmt(pFVar35,&pStmt,pcVar14);
                local_40 = pFVar36;
                do {
                  psVar30 = pStmt;
                  if (((int)(pFVar28->base).iRowid != 0) ||
                     (iVar8 = sqlite3_step(pStmt), iVar8 != 100)) break;
                  iVar8 = sqlite3_column_bytes(psVar30,1);
                  local_118 = sqlite3_column_text(psVar30,1);
                  pMVar17 = columnMem(psVar30,2);
                  uVar27 = sqlite3VdbeIntValue(pMVar17);
                  columnMallocFailure(psVar30);
                  pMVar17 = columnMem(psVar30,3);
                  local_38 = sqlite3VdbeIntValue(pMVar17);
                  columnMallocFailure(psVar30);
                  if ((int)uVar27 < pFVar36->pgnoFirst) {
                    bVar37 = false;
                  }
                  else {
                    pFVar22 = fts5LeafRead(pFVar35,(long)(int)uVar27 +
                                                   ((ulong)(uint)pFVar36->iSegid << 0x25));
                    bVar37 = true;
                    if (pFVar22 != (Fts5Data *)0x0) {
                      iVar31 = pFVar22->szLeaf;
                      if (iVar31 < pFVar22->nn) {
                        puVar6 = (ushort *)pFVar22->p;
                        local_c8 = uVar27;
                        sqlite3Fts5GetVarint32((uchar *)((long)puVar6 + (long)iVar31),(u32 *)&nRow);
                        iVar9 = (int)nRow;
                        if (((int)nRow < iVar31) &&
                           ((int)(uint)(ushort)(*puVar6 << 8 | *puVar6 >> 8) < (int)nRow)) {
                          iVar10 = sqlite3Fts5GetVarint32
                                             ((uchar *)((long)puVar6 + (nRow & 0xffffffffU)),
                                              (u32 *)&nTerm);
                          iVar29 = nTerm - iVar8;
                          iVar11 = nTerm;
                          if (iVar8 <= nTerm) {
                            iVar11 = iVar8;
                          }
                          if (iVar11 == 0) {
                            iVar8 = 0;
                          }
                          else {
                            iVar8 = memcmp((void *)((long)puVar6 + (ulong)(uint)(iVar10 + iVar9)),
                                           local_118,(long)iVar11);
                          }
                          if (iVar8 != 0) {
                            iVar29 = iVar8;
                          }
                          if (iVar29 < 0) goto LAB_001c534a;
                        }
                        else {
LAB_001c534a:
                          *(int *)&(local_140->base).iRowid = 0x10b;
                        }
                        nRow = 0;
                        uStack_130 = 0;
                        pScan = (sqlite3_stmt *)0x0;
                        uStack_d0 = 0;
                        lVar15 = 0;
                        pFVar28 = local_140;
                        do {
                          if ((int)(pFVar28->base).iRowid != 0) break;
                          iVar11 = (int)lVar15;
                          puVar21 = pFVar22->p;
                          iVar9 = sqlite3Fts5GetVarint32(puVar21 + iVar31,(u32 *)&nIncr);
                          lVar15 = (long)iVar11 + (long)nIncr;
                          iVar8 = pFVar22->szLeaf;
                          iVar29 = (int)lVar15;
                          if (iVar29 < iVar8) {
                            local_118 = (uchar *)CONCAT44(local_118._4_4_,iVar9);
                            if (iVar11 == 0) {
                              iVar9 = sqlite3Fts5GetVarint32(puVar21 + lVar15,(u32 *)&nKeep);
                              pFVar28 = local_140;
                              if (iVar8 < iVar9 + iVar29 + nKeep) {
                                *(int *)&(local_140->base).iRowid = 0x10b;
                              }
                              else {
                                uStack_130 = uStack_130 & 0xffffffff00000000;
                                sqlite3Fts5BufferAppendBlob
                                          ((int *)local_140,(Fts5Buffer *)&nRow,nKeep,
                                           puVar21 + (iVar9 + iVar29));
                              }
                              iVar9 = (int)local_118;
                            }
                            else {
                              iVar9 = sqlite3Fts5GetVarint32(puVar21 + iVar29,(u32 *)&nKeep);
                              iVar11 = sqlite3Fts5GetVarint32(puVar21 + (iVar9 + iVar29),&local_78);
                              pFVar28 = local_140;
                              if (((int)(u32)uStack_130 < nKeep) ||
                                 (iVar11 = iVar9 + iVar29 + iVar11, iVar8 < (int)(local_78 + iVar11)
                                 )) {
                                *(int *)&(local_140->base).iRowid = 0x10b;
                              }
                              else {
                                uStack_130 = CONCAT44(uStack_130._4_4_,nKeep);
                                sqlite3Fts5BufferAppendBlob
                                          ((int *)local_140,(Fts5Buffer *)&nRow,local_78,
                                           puVar21 + iVar11);
                              }
                              iVar9 = (int)local_118;
                              if ((int)(pFVar28->base).iRowid == 0) {
                                iVar11 = (u32)uStack_130 - (int)uStack_d0;
                                iVar8 = (int)uStack_d0;
                                if ((int)(u32)uStack_130 < (int)uStack_d0) {
                                  iVar8 = (u32)uStack_130;
                                }
                                if (iVar8 == 0) {
                                  iVar8 = 0;
                                }
                                else {
                                  iVar8 = memcmp((void *)nRow,pScan,(long)iVar8);
                                  iVar9 = (int)local_118;
                                }
                                if (iVar8 != 0) {
                                  iVar11 = iVar8;
                                }
                                pFVar28 = local_140;
                                if (iVar11 < 1) goto LAB_001c53ff;
                              }
                            }
                          }
                          else {
LAB_001c53ff:
                            *(int *)&(local_140->base).iRowid = 0x10b;
                            pFVar28 = local_140;
                          }
                          iVar31 = iVar31 + iVar9;
                          uStack_d0 = uStack_d0 & 0xffffffff00000000;
                          sqlite3Fts5BufferAppendBlob
                                    ((int *)pFVar28,(Fts5Buffer *)&pScan,(u32)uStack_130,(u8 *)nRow)
                          ;
                        } while (iVar31 < pFVar22->nn);
                        sqlite3_free((void *)nRow);
                        nRow = 0;
                        uStack_130._0_4_ = 0;
                        uStack_130._4_4_ = 0;
                        sqlite3_free(pScan);
                        uVar27 = local_c8;
                        pFVar35 = local_68;
                      }
                      else {
                        *(int *)&(pFVar28->base).iRowid = 0x10b;
                      }
                      sqlite3_free(pFVar22);
                      pFVar36 = local_40;
                      if ((int)(pFVar28->base).iRowid == 0) {
                        iVar8 = (int)uVar27 + -1;
                        local_c8 = uVar27;
                        if ((int)local_98 < iVar8) {
                          iVar31 = (int)local_b0;
                          lVar15 = (long)((int)local_98 + 1);
                          do {
                            pFVar22 = fts5DataRead(pFVar35,((ulong)(uint)pFVar36->iSegid << 0x25) +
                                                           lVar15);
                            if (pFVar22 != (Fts5Data *)0x0) {
                              if (pFVar22->szLeaf < pFVar22->nn) {
                                *(int *)&(pFVar28->base).iRowid = 0x10b;
                              }
                              if ((iVar31 + 1 <= lVar15) &&
                                 (pFVar22->p[1] != '\0' || *pFVar22->p != '\0')) {
                                *(int *)&(pFVar28->base).iRowid = 0x10b;
                              }
                            }
                            sqlite3_free(pFVar22);
                          } while ((lVar15 < iVar8) &&
                                  (lVar15 = lVar15 + 1, (int)(pFVar28->base).iRowid == 0));
                        }
                        bVar37 = true;
                        if ((int)(pFVar28->base).iRowid == 0) {
                          if ((int)local_38 == 0) {
                            local_b0 = (ulong)(uint)pFVar36->pgnoLast;
                            bVar37 = false;
                            local_98 = local_c8;
                          }
                          else {
                            uVar24 = pFVar36->iSegid;
                            local_b0 = 0;
                            pIter = fts5DlidxIterInit(pFVar35,0,uVar24,(int)local_c8);
                            if ((pFVar35->rc == 0) && (pIter->aLvl[0].bEof == 0)) {
                              lVar15 = (ulong)uVar24 << 0x25;
                              uVar27 = local_c8;
                              do {
                                uVar12 = (int)uVar27 + 1;
                                uVar23 = (ulong)uVar12;
                                uVar24 = pIter->aLvl[0].iLeafPgno;
                                uVar27 = (ulong)uVar24;
                                if ((int)uVar12 < (int)uVar24) {
                                  uVar23 = (ulong)(int)uVar12;
                                  do {
                                    pFVar22 = fts5DataRead(pFVar35,lVar15 + uVar23);
                                    if (pFVar22 != (Fts5Data *)0x0) {
                                      if (pFVar22->p[1] != '\0' || *pFVar22->p != '\0') {
                                        *(int *)&(local_140->base).iRowid = 0x10b;
                                      }
                                      sqlite3_free(pFVar22);
                                    }
                                    uVar23 = uVar23 + 1;
                                    uVar27 = (ulong)pIter->aLvl[0].iLeafPgno;
                                  } while ((long)uVar23 < (long)uVar27);
                                }
                                local_b0 = uVar23;
                                pFVar22 = fts5DataRead(pFVar35,(int)uVar27 + lVar15);
                                if (pFVar22 != (Fts5Data *)0x0) {
                                  uVar7 = *(ushort *)pFVar22->p;
                                  uVar7 = uVar7 << 8 | uVar7 >> 8;
                                  if ((pFVar22->szLeaf <= (int)(uint)uVar7) ||
                                     (sqlite3Fts5GetVarint
                                                ((uchar *)((long)pFVar22->p + (ulong)uVar7),
                                                 (u64 *)&nRow), nRow != pIter->aLvl[0].iRowid)) {
                                    *(int *)&(local_140->base).iRowid = 0x10b;
                                  }
                                  sqlite3_free(pFVar22);
                                }
                                fts5DlidxIterNextR(pFVar35,pIter,0);
                              } while ((pFVar35->rc == 0) && (pIter->aLvl[0].bEof == 0));
                            }
                            fts5DlidxIterFree(pIter);
                            bVar37 = false;
                            local_98 = local_c8;
                            pFVar28 = local_140;
                          }
                        }
                      }
                      else {
                        bVar37 = true;
                      }
                    }
                  }
                } while (!bVar37);
                iVar8 = sqlite3_finalize(pStmt);
                pFVar32 = local_50;
                lVar15 = local_48;
                if ((int)(pFVar28->base).iRowid == 0) {
                  *(int *)&(pFVar28->base).iRowid = iVar8;
                }
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < pFVar32->nSeg);
          }
          lVar15 = local_58 + 1;
        } while (lVar15 < local_b8->nLevel);
      }
      uVar27 = 0;
      fts5MultiIterNew(pFVar35,local_b8,0x20,(Fts5Colset *)0x0,(u8 *)0x0,0,-1,0,(Fts5Iter **)&nRow);
      pFVar28 = (Fts5Iter *)nRow;
      if (pFVar35->rc == 0) {
        local_118 = (uchar *)(nRow + 0x60);
        bVar37 = true;
        uVar27 = 0;
        local_140 = (Fts5Iter *)nRow;
        do {
          if ((pFVar28->base).bEof != '\0') break;
          pScan = (sqlite3_stmt *)0x0;
          pStmt = (sqlite3_stmt *)((ulong)pStmt & 0xffffffff00000000);
          lVar33 = (ulong)pFVar28->aFirst[1].iFirst * 0x78;
          lVar15 = *(long *)(local_118 + lVar33 + 0x68);
          uVar24 = *(uint *)(local_118 + lVar33 + 0x60);
          lVar26 = *(long *)(local_118 + lVar33 + 0x58);
          if (local_80 == 1) {
            if (((!bVar37) || (*(long *)(local_118 + lVar33 + 0x10) == 0)) ||
               (*(int *)(local_118 + lVar33 + 0x70) != 0)) {
              uVar23 = lVar15 * 0x51;
              if (0 < (int)uVar24) {
                uVar25 = 0;
                do {
                  uVar23 = uVar23 * 9 + (long)*(char *)(lVar26 + uVar25);
                  uVar25 = uVar25 + 1;
                } while (uVar24 != uVar25);
              }
              uVar27 = uVar27 ^ uVar23;
            }
          }
          else {
            uStack_120 = uStack_120 & 0xffffffff00000000;
            fts5SegiterPoslist(pFVar35,(Fts5SegIter *)(local_118 + lVar33),(Fts5Colset *)0x0,
                               (Fts5Buffer *)&rc);
            puVar21 = _rc;
            iVar8 = (int)uStack_120;
            iVar31 = sqlite3Fts5PoslistNext64(_rc,(int)uStack_120,(int *)&pStmt,(i64 *)&pScan);
            if (iVar31 == 0) {
              do {
                uVar23 = (ulong)((uint)pScan & 0x7fffffff) +
                         (((long)pScan >> 0x20) + lVar15 * 9) * 9;
                if (0 < (int)uVar24) {
                  uVar25 = 0;
                  do {
                    uVar23 = uVar23 * 9 + (long)*(char *)(lVar26 + uVar25);
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar27 = uVar27 ^ uVar23;
                iVar31 = sqlite3Fts5PoslistNext64(puVar21,iVar8,(int *)&pStmt,(i64 *)&pScan);
              } while (iVar31 == 0);
            }
          }
          pFVar35 = local_68;
          pFVar28 = local_140;
          fts5MultiIterNext(local_68,local_140,0,0);
          bVar37 = pFVar35->rc == 0;
        } while (bVar37);
      }
      fts5MultiIterFree(pFVar28);
      if ((pFVar35->rc == 0) && (uVar27 != local_60)) {
        pFVar35->rc = 0x10b;
      }
      fts5StructureRelease(local_b8);
      sqlite3_free(_rc);
      _rc = (u8 *)0x0;
      uStack_120._0_4_ = 0;
      uStack_120._4_4_ = 0;
      iVar8 = pFVar35->rc;
      pFVar35->rc = 0;
    }
    sqlite3_free(local_a0);
    pVtab = local_90;
  }
LAB_001c4d52:
  local_144 = iVar8;
  (pVtab[1].pModule)->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)0x0;
  return local_144;
}

Assistant:

static int fts5UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  Fts5Config *pConfig = pTab->p.pConfig;
  int eType0;                     /* value_type() of apVal[0] */
  int rc = SQLITE_OK;             /* Return code */

  /* A transaction must be open when this is called. */
  assert( pTab->ts.eState==1 );

  assert( pVtab->zErrMsg==0 );
  assert( nArg==1 || nArg==(2+pConfig->nCol+2) );
  assert( sqlite3_value_type(apVal[0])==SQLITE_INTEGER 
       || sqlite3_value_type(apVal[0])==SQLITE_NULL 
  );
  assert( pTab->p.pConfig->pzErrmsg==0 );
  pTab->p.pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Put any active cursors into REQUIRE_SEEK state. */
  fts5TripCursors(pTab);

  eType0 = sqlite3_value_type(apVal[0]);
  if( eType0==SQLITE_NULL 
   && sqlite3_value_type(apVal[2+pConfig->nCol])!=SQLITE_NULL 
  ){
    /* A "special" INSERT op. These are handled separately. */
    const char *z = (const char*)sqlite3_value_text(apVal[2+pConfig->nCol]);
    if( pConfig->eContent!=FTS5_CONTENT_NORMAL 
      && 0==sqlite3_stricmp("delete", z) 
    ){
      rc = fts5SpecialDelete(pTab, apVal);
    }else{
      rc = fts5SpecialInsert(pTab, z, apVal[2 + pConfig->nCol + 1]);
    }
  }else{
    /* A regular INSERT, UPDATE or DELETE statement. The trick here is that
    ** any conflict on the rowid value must be detected before any 
    ** modifications are made to the database file. There are 4 cases:
    **
    **   1) DELETE
    **   2) UPDATE (rowid not modified)
    **   3) UPDATE (rowid modified)
    **   4) INSERT
    **
    ** Cases 3 and 4 may violate the rowid constraint.
    */
    int eConflict = SQLITE_ABORT;
    if( pConfig->eContent==FTS5_CONTENT_NORMAL ){
      eConflict = sqlite3_vtab_on_conflict(pConfig->db);
    }

    assert( eType0==SQLITE_INTEGER || eType0==SQLITE_NULL );
    assert( nArg!=1 || eType0==SQLITE_INTEGER );

    /* Filter out attempts to run UPDATE or DELETE on contentless tables.
    ** This is not suported.  */
    if( eType0==SQLITE_INTEGER && fts5IsContentless(pTab) ){
      pTab->p.base.zErrMsg = sqlite3_mprintf(
          "cannot %s contentless fts5 table: %s", 
          (nArg>1 ? "UPDATE" : "DELETE from"), pConfig->zName
      );
      rc = SQLITE_ERROR;
    }

    /* DELETE */
    else if( nArg==1 ){
      i64 iDel = sqlite3_value_int64(apVal[0]);  /* Rowid to delete */
      rc = sqlite3Fts5StorageDelete(pTab->pStorage, iDel, 0);
    }

    /* INSERT or UPDATE */
    else{
      int eType1 = sqlite3_value_numeric_type(apVal[1]);

      if( eType1!=SQLITE_INTEGER && eType1!=SQLITE_NULL ){
        rc = SQLITE_MISMATCH;
      }

      else if( eType0!=SQLITE_INTEGER ){     
        /* If this is a REPLACE, first remove the current entry (if any) */
        if( eConflict==SQLITE_REPLACE && eType1==SQLITE_INTEGER ){
          i64 iNew = sqlite3_value_int64(apVal[1]);  /* Rowid to delete */
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0);
        }
        fts5StorageInsert(&rc, pTab, apVal, pRowid);
      }

      /* UPDATE */
      else{
        i64 iOld = sqlite3_value_int64(apVal[0]);  /* Old rowid */
        i64 iNew = sqlite3_value_int64(apVal[1]);  /* New rowid */
        if( eType1==SQLITE_INTEGER && iOld!=iNew ){
          if( eConflict==SQLITE_REPLACE ){
            rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0);
            }
            fts5StorageInsert(&rc, pTab, apVal, pRowid);
          }else{
            rc = sqlite3Fts5StorageContentInsert(pTab->pStorage, apVal, pRowid);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageIndexInsert(pTab->pStorage, apVal,*pRowid);
            }
          }
        }else{
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
          fts5StorageInsert(&rc, pTab, apVal, pRowid);
        }
      }
    }
  }

  pTab->p.pConfig->pzErrmsg = 0;
  return rc;
}